

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O3

cilk_fiber * cilk_fiber::allocate_from_thread(void)

{
  cilk_fiber_sysdep *this;
  
  this = (cilk_fiber_sysdep *)__cilkrts_malloc(0x98);
  if (this != (cilk_fiber_sysdep *)0x0) {
    cilk_fiber_sysdep::cilk_fiber_sysdep(this,from_thread);
    return &this->super_cilk_fiber;
  }
  allocate_from_thread();
}

Assistant:

cilk_fiber* cilk_fiber::allocate_from_thread()
{
    void* retmem = __cilkrts_malloc(sizeof(cilk_fiber_sysdep));
    CILK_ASSERT(retmem);
    cilk_fiber_sysdep* ret = ::new(retmem) cilk_fiber_sysdep(from_thread);

    // A fiber allocated from a thread begins with a reference count
    // of 2.  The first is for being created, and the second is for
    // being running.
    //
    // Suspending this fiber will decrement the count down to 1.
    ret->init_ref_count(2);

#if SUPPORT_GET_CURRENT_FIBER    
    // We're creating the main fiber for this thread. Set this fiber as the
    // current fiber.
    cilkos_set_tls_cilk_fiber(ret);
#endif
    return ret;
}